

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O3

void decorated_win_size(Fl_Window *win,int *w,int *h)

{
  int iVar1;
  uint n;
  Window *children;
  Window parent;
  Window root;
  XWindowAttributes attributes;
  undefined1 local_b8 [8];
  long local_b0;
  long local_a8;
  undefined1 local_a0 [8];
  int local_98;
  int local_94;
  
  *w = (win->super_Fl_Group).super_Fl_Widget.w_;
  *h = (win->super_Fl_Group).super_Fl_Widget.h_;
  if (((win->i != (Fl_X *)0x0) && ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0)
      ) && (((win->super_Fl_Group).super_Fl_Widget.flags_ & 10) == 0)) {
    iVar1 = XQueryTree(fl_display,win->i->xid,&local_a8,&local_b0,local_b8);
    if ((iVar1 != 0) && (local_a8 != local_b0)) {
      XGetWindowAttributes(fl_display,local_b0,local_a0);
      *w = local_98;
      *h = local_94;
    }
    return;
  }
  return;
}

Assistant:

int w() const {return w_;}